

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

void Saig_ManCbaStop(Saig_ManCba_t *p)

{
  Vec_Vec_t *pVVar1;
  void *pvVar2;
  int *__ptr;
  long lVar3;
  
  pVVar1 = p->vReg2Frame;
  if (pVVar1 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar1->nSize) {
      lVar3 = 0;
      do {
        pvVar2 = pVVar1->pArray[lVar3];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar1->nSize);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
    p->vReg2Frame = (Vec_Vec_t *)0x0;
  }
  pVVar1 = p->vReg2Value;
  if (pVVar1 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar1->nSize) {
      lVar3 = 0;
      do {
        pvVar2 = pVVar1->pArray[lVar3];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar1->nSize);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
    p->vReg2Value = (Vec_Vec_t *)0x0;
  }
  Aig_ManStopP(&p->pFrames);
  if (p->vMapPiF2A != (Vec_Int_t *)0x0) {
    __ptr = p->vMapPiF2A->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      p->vMapPiF2A->pArray = (int *)0x0;
    }
    if (p->vMapPiF2A != (Vec_Int_t *)0x0) {
      free(p->vMapPiF2A);
      p->vMapPiF2A = (Vec_Int_t *)0x0;
    }
  }
  if (p != (Saig_ManCba_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Saig_ManCbaStop( Saig_ManCba_t * p )
{
    Vec_VecFreeP( &p->vReg2Frame );
    Vec_VecFreeP( &p->vReg2Value );
    Aig_ManStopP( &p->pFrames );
    Vec_IntFreeP( &p->vMapPiF2A );
    ABC_FREE( p );
}